

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void tmvline4_addclamp(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  pbVar4 = dc_dest;
  iVar5 = dc_count;
  do {
    lVar9 = 0;
    lVar7 = 0;
    pbVar10 = pbVar4;
    do {
      uVar8 = (ulong)*(byte *)(*(long *)((long)bufplce + lVar9) +
                              (ulong)(*(uint *)((long)vplce + lVar7) >> ((byte)iVar3 & 0x3f)));
      if (uVar8 != 0) {
        uVar6 = pDVar2[*pbVar10] + pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar9) + uVar8)]
                & 0x40100400;
        uVar6 = uVar6 - (uVar6 >> 5) |
                pDVar2[*pbVar10] + pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar9) + uVar8)]
                & 0x3e0f83e0 | 0x1f07c1f;
        *pbVar10 = RGB32k.All[uVar6 >> 0xf & uVar6];
      }
      *(int *)((long)vplce + lVar7) = *(int *)((long)vplce + lVar7) + *(int *)((long)vince + lVar7);
      lVar7 = lVar7 + 4;
      pbVar10 = pbVar10 + 1;
      lVar9 = lVar9 + 8;
    } while (lVar7 != 0x10);
    pbVar4 = pbVar4 + dc_pitch;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void tmvline4_addclamp ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD a = fg2rgb[palookupoffse[i][pix]] + bg2rgb[dest[i]];
				DWORD b = a;

				a |= 0x01f07c1f;
				b &= 0x40100400;
				a &= 0x3fffffff;
				b = b - (b >> 5);
				a |= b;
				dest[i] = RGB32k.All[a & (a>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}